

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CheckType(LlvmCompilationContext *ctx,ExprBase *node,LLVMValueRef value)

{
  LLVMTypeRef pLVar1;
  TypeBase *type;
  LLVMTypeRef pLVar2;
  LLVMTypeRef expectedType;
  LLVMTypeRef valueType;
  LLVMValueRef value_local;
  ExprBase *node_local;
  LlvmCompilationContext *ctx_local;
  
  if (value == (LLVMValueRef)0x0) {
    if (node->type != ctx->ctx->typeVoid) {
      __assert_fail("node->type == ctx.ctx.typeVoid",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x27b,
                    "LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)");
    }
    ctx_local = (LlvmCompilationContext *)0x0;
  }
  else {
    pLVar1 = LLVMTypeOf(value);
    type = GetStackType(ctx,node->type);
    pLVar2 = CompileLlvmType(ctx,type);
    ctx_local = (LlvmCompilationContext *)value;
    if (pLVar1 != pLVar2) {
      printf("Wrong result type\nExpected: ");
      LLVMDumpType(pLVar2);
      printf("\n     Got: ");
      LLVMDumpType(pLVar1);
      printf("\n");
      __assert_fail("!\"wrong result type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x28b,
                    "LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)");
    }
  }
  return (LLVMValueRef)ctx_local;
}

Assistant:

LLVMValueRef CheckType(LlvmCompilationContext &ctx, ExprBase *node, LLVMValueRef value)
{
	if(!value)
	{
		assert(node->type == ctx.ctx.typeVoid);

		return NULL;
	}

	LLVMTypeRef valueType = LLVMTypeOf(value);
	LLVMTypeRef expectedType = CompileLlvmType(ctx, GetStackType(ctx, node->type));

	if(valueType != expectedType)
	{
		printf("Wrong result type\nExpected: ");
		LLVMDumpType(expectedType);
		printf("\n     Got: ");
		LLVMDumpType(valueType);
		printf("\n");

		assert(!"wrong result type");
	}

	return value;
}